

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

int __thiscall TPZFMatrix<long>::Decompose_LU(TPZFMatrix<long> *this,TPZVec<int> *index)

{
  int *piVar1;
  _func_int *p_Var2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  int extraout_var_10;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long aux;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  TPZVec<int> *local_50;
  long local_48;
  long local_40;
  undefined8 local_38;
  
  iVar4 = 0;
  if ((this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed == '\0') {
    local_70 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
    if (local_70 == (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol) {
      (*index->_vptr_TPZVec[3])(index,local_70);
      piVar1 = index->fStore;
      lVar7 = 0;
      local_48 = 0;
      if (0 < local_70) {
        local_48 = local_70;
      }
      for (; local_48 != lVar7; lVar7 = lVar7 + 1) {
        piVar1[lVar7] = (int)lVar7;
      }
      local_58 = 1;
      lVar7 = 0;
      local_50 = index;
      while (lVar7 != local_48) {
        for (lVar10 = 0; lVar10 != local_58; lVar10 = lVar10 + 1) {
          lVar9 = 0;
          for (lVar8 = 0;
              p_Var2 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                       _vptr_TPZSavable[0x21], lVar10 != lVar8; lVar8 = lVar8 + 1) {
            iVar4 = (*p_Var2)(this,lVar10,lVar8);
            iVar5 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x21])(this,lVar8,lVar7);
            lVar9 = lVar9 + CONCAT44(extraout_var_00,iVar5) * CONCAT44(extraout_var,iVar4);
          }
          iVar4 = (*p_Var2)(this,lVar10,lVar7);
          aux = CONCAT44(extraout_var_01,iVar4) - lVar9;
          (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(this,lVar10,lVar7,&aux);
        }
        iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x21])(this,lVar7,lVar7);
        local_60 = CONCAT44(extraout_var_02,iVar4);
        lVar10 = lVar7 + 1;
        local_68 = lVar7;
        local_40 = lVar10;
        for (; lVar8 = local_70, lVar10 < local_70; lVar10 = lVar10 + 1) {
          lVar8 = 0;
          for (lVar9 = 0;
              p_Var2 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                       _vptr_TPZSavable[0x21], lVar7 != lVar9; lVar9 = lVar9 + 1) {
            iVar4 = (*p_Var2)(this,lVar10,lVar9);
            iVar5 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x21])(this,lVar9,lVar7);
            lVar8 = lVar8 + CONCAT44(extraout_var_04,iVar5) * CONCAT44(extraout_var_03,iVar4);
          }
          iVar4 = (*p_Var2)(this,lVar10,lVar7);
          aux = CONCAT44(extraout_var_05,iVar4) - lVar8;
          (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(this,lVar10,lVar7,&aux);
          iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                    _vptr_TPZSavable[0x21])(this,lVar10,lVar7);
          if (ABS((double)local_60) < ABS((double)CONCAT44(extraout_var_06,iVar4))) {
            iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x21])(this,lVar10,lVar7);
            local_60 = CONCAT44(extraout_var_07,iVar4);
            local_68 = lVar10;
          }
        }
        lVar9 = local_40;
        lVar10 = local_40;
        if (lVar7 < local_68) {
          for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
            iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x21])(this,lVar7,lVar10);
            lVar9 = local_68;
            aux = CONCAT44(extraout_var_08,iVar4);
            iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x21])(this,local_68,lVar10);
            local_38 = CONCAT44(extraout_var_09,iVar4);
            (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0x23])(this,lVar7,lVar10,&local_38);
            (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0x23])(this,lVar9,lVar10,&aux);
          }
          piVar1 = local_50->fStore;
          iVar4 = piVar1[lVar7];
          piVar1[lVar7] = piVar1[local_68];
          piVar1[local_68] = iVar4;
          lVar9 = local_40;
          lVar10 = local_40;
        }
        for (; lVar9 < lVar8; lVar9 = lVar9 + 1) {
          iVar4 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                    _vptr_TPZSavable[0x21])(this,lVar9,lVar7);
          auVar3._4_4_ = extraout_var_10;
          auVar3._0_4_ = iVar4;
          auVar3._8_8_ = (long)extraout_var_10 >> 0x1f;
          aux = SUB168(auVar3 / SEXT816(local_60),0);
          (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(this,lVar9,lVar7,&aux);
        }
        local_58 = local_58 + 1;
        lVar7 = lVar10;
      }
      (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed = '\x02';
      iVar4 = 1;
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2dfca8);
      std::endl<char,std::char_traits<char>>(poVar6);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int TPZFMatrix<TVar>::Decompose_LU(TPZVec<int> &index) {
    
    if (this->fDecomposed) return 0;
    
    if ( this->Rows() != this->Cols() ) {
        cout << "TPZFPivotMatrix::DecomposeLU ERRO : A Matriz não é quadrada" << endl;
        return 0;
    }
    
    int64_t i,j,k;
    TVar sum = 0.;
    int64_t nRows = this->Rows();
    int64_t nCols = this->Cols();
    
    index.Resize(nRows);
    //inicializo o vetor de índices para o caso de pivotamento
    for (i=0;i<nRows;i++) index[i] = i;
    
    //LU
    for (j=0;j<nCols;j++){
        // cout << "line..." << j << endl;
        for (i=0;i<=j;i++){
            sum = 0.;
            for (k=0;k<i;k++){
                sum += this->Get(i,k) * this->Get(k,j);
            }
            TVar aux = this->Get(i,j);
            PutVal(i,j,(aux - sum));
            //cout << "0_A[" << i << "," << j << "]= " << Get(i,j) << endl;
        }
        //Print(cout);
        TVar piv = this->Get(j,j);
        //  cout << "Pivo 1 =" << piv << endl;
        int64_t row = j;
        for (i=j+1;i<nRows;i++){
            sum = 0.;
            for (k=0;k<(j);k++){
                sum += this->Get(i,k) * this->Get(k,j);
            }
            TVar aux = this->Get(i,j);
            PutVal(i,j,(aux - sum));
            //cout << "1_A[" << i << "," << j << "]= " << Get(i,j) << endl;
            
            if (fabs(this->Get(i,j)) > fabs(piv)){
                piv = this->Get(i,j);
                //  cout << "Pivo 2 =" << piv << endl;
                row = i;
            }
        }
        //    Print(cout);
        if (row > j){
            for (k=0;k<nCols;k++){
                TVar aux = this->Get(j,k);
                PutVal(j,k,this->Get(row,k));
                //cout << "2_A[" << j << "," << k << "]= " << Get(j,k) << endl;
                PutVal(row,k,aux);
                //cout << "3_A[" << row << "," << k << "]= " << Get(row,k) << endl;
            }
            k = index[j];
            index[j] = index[row];
            index[row] = k;
        }
        //    cout << "Pivo = " << piv << endl;
        for (i=j+1;i<nRows;i++){
            if (fabs(piv) < fabs((TVar)1e-12)) {
                cout << "Pivot < 1e-12. Probably matrix is singular." << endl;
                DebugStop();
            }
            TVar aux = this->Get(i,j) / piv;
            PutVal(i,j,aux);
            //cout << "4_A[" << i << "," << j << "]= " << Get(i,j) << endl;
        }
        //Print(cout);
    }
    this->fDecomposed = ELUPivot;
    return 1;
}